

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

void __thiscall ON_2fPoint::Transform(ON_2fPoint *this,ON_Xform *xform)

{
  double dVar1;
  ON_2fPoint OVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (double)this->x;
  dVar3 = (double)this->y;
  dVar4 = xform->m_xform[3][0] * dVar1 + xform->m_xform[3][1] * dVar3 + xform->m_xform[3][3];
  dVar4 = (double)(~-(ulong)(dVar4 != 0.0) & (ulong)dVar4 |
                  (ulong)(1.0 / dVar4) & -(ulong)(dVar4 != 0.0));
  OVar2.x = (float)(dVar4 * (xform->m_xform[0][3] +
                            dVar1 * xform->m_xform[0][0] + dVar3 * xform->m_xform[0][1]));
  OVar2.y = (float)(dVar4 * (xform->m_xform[1][3] +
                            dVar1 * xform->m_xform[1][0] + dVar3 * xform->m_xform[1][1]));
  *this = OVar2;
  return;
}

Assistant:

void ON_2fPoint::Transform( const ON_Xform& xform )
{
  double xx,yy,ww;
  ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][3];
  if ( ww != 0.0 )
    ww = 1.0/ww;
  xx = ww*(xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][3]);
  yy = ww*(xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][3]);
  x = (float)xx;
  y = (float)yy;
}